

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O2

void __thiscall QTuioHandler::process2DCurAlive(QTuioHandler *this,QOscMessage *message)

{
  qsizetype *this_00;
  bool bVar1;
  int iVar2;
  QDebug *pQVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  qsizetype asize;
  ulong uVar7;
  long in_FS_OFFSET;
  int cursorId;
  QList<QVariant> local_a8;
  QArrayDataPointer<QVariant> local_90;
  undefined1 local_78 [20];
  float local_64;
  State local_60;
  undefined1 local_58 [4];
  undefined1 local_54 [16];
  float local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d = (message->m_arguments).d.d;
  local_90.ptr = (message->m_arguments).d.ptr;
  local_90.size = (message->m_arguments).d.size;
  if (local_90.d != (Data *)0x0) {
    LOCK();
    ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.d.size = *(qsizetype *)(this + 0x28);
  if ((int *)local_a8.d.size != (int *)0x0) {
    LOCK();
    *(int *)local_a8.d.size = *(int *)local_a8.d.size + 1;
    UNLOCK();
  }
  local_a8.d.ptr = (QVariant *)0x0;
  uVar7 = 1;
  lVar6 = 0x20;
  this_00 = &local_a8.d.size;
  do {
    if ((ulong)local_90.size <= uVar7) {
      if ((int *)local_a8.d.size == (int *)0x0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
        asize = 0;
      }
      else {
        p_Var4 = *(_Rb_tree_node_base **)(local_a8.d.size + 0x20);
        asize = *(qsizetype *)(local_a8.d.size + 0x30);
      }
      QList<QTuioCursor>::reserve((QList<QTuioCursor> *)(this + 0x30),asize);
      while( true ) {
        p_Var5 = (_Rb_tree_node_base *)(local_a8.d.size + 0x10);
        if ((int *)local_a8.d.size == (int *)0x0) {
          p_Var5 = (_Rb_tree_node_base *)0x0;
        }
        if (p_Var4 == p_Var5) break;
        QList<QTuioCursor>::emplaceBack<QTuioCursor_const&>
                  ((QList<QTuioCursor> *)(this + 0x30),(QTuioCursor *)&p_Var4[1].field_0x4);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
      ::operator=((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                   *)(this + 0x28),
                  (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                   *)&local_a8.d.ptr);
LAB_00108f7c:
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                  *)&local_a8.d.ptr);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2
                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                  *)&local_a8.d.size);
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_90);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    iVar2 = QVariant::typeId((QVariant *)((long)&((local_90.ptr)->d).data + lVar6));
    if (iVar2 != 2) {
      lcTuioHandler();
      if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) !=
          0) {
        local_58 = (undefined1  [4])0x2;
        local_54 = ZEXT816(0);
        local_44 = 0.0;
        local_40 = lcTuioHandler::category.name;
        QMessageLogger::warning();
        pQVar3 = QDebug::operator<<((QDebug *)&cursorId,
                                    "Ignoring malformed TUIO alive message (bad argument on position"
                                   );
        pQVar3 = QDebug::operator<<(pQVar3,(int)uVar7);
        local_a8.d.d = (Data *)pQVar3->stream;
        *(int *)((long)local_a8.d.d + 0x28) = *(int *)((long)local_a8.d.d + 0x28) + 1;
        operator<<((Stream *)local_78,&local_a8);
        QDebug::operator<<((QDebug *)local_78,')');
        QDebug::~QDebug((QDebug *)local_78);
        QDebug::~QDebug((QDebug *)&local_a8);
        QDebug::~QDebug((QDebug *)&cursorId);
      }
      goto LAB_00108f7c;
    }
    cursorId = QVariant::toInt((bool *)((long)&((local_90.ptr)->d).data + lVar6));
    bVar1 = QMap<int,_QTuioCursor>::contains((QMap<int,_QTuioCursor> *)this_00,&cursorId);
    if (bVar1) {
      local_58 = (undefined1  [4])0xaaaaaaaa;
      local_54._8_4_ = 0xffffffff;
      local_54._0_8_ = 0xffffffffffffffff;
      local_54._12_4_ = 0xffffffff;
      local_44 = -NAN;
      local_40 = (char *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
      local_78._0_4_ = -1;
      local_78._4_16_ = (undefined1  [16])0x0;
      local_64 = 0.0;
      local_60 = Pressed;
      QMap<int,_QTuioCursor>::value
                ((QTuioCursor *)local_58,(QMap<int,_QTuioCursor> *)this_00,&cursorId,
                 (QTuioCursor *)local_78);
      local_40 = (char *)CONCAT71(local_40._1_7_,4);
      QMap<int,_QTuioCursor>::insert
                ((QMap<int,_QTuioCursor> *)&local_a8.d.ptr,&cursorId,(QTuioCursor *)local_58);
      QMap<int,_QTuioCursor>::remove((QMap<int,_QTuioCursor> *)this_00,(char *)&cursorId);
    }
    else {
      local_40 = (char *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
      local_58 = (undefined1  [4])cursorId;
      local_54 = (undefined1  [16])0x0;
      local_44 = 0.0;
      local_40 = (char *)CONCAT71(local_40._1_7_,1);
      QMap<int,_QTuioCursor>::insert
                ((QMap<int,_QTuioCursor> *)&local_a8.d.ptr,&cursorId,(QTuioCursor *)local_58);
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x20;
  } while( true );
}

Assistant:

void QTuioHandler::process2DCurAlive(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();

    // delta the notified cursors that are active, against the ones we already
    // know of.
    //
    // TBD: right now we're assuming one 2Dcur alive message corresponds to a
    // new data source from the input. is this correct, or do we need to store
    // changes and only process the deltas on fseq?
    QMap<int, QTuioCursor> oldActiveCursors = m_activeCursors;
    QMap<int, QTuioCursor> newActiveCursors;

    for (int i = 1; i < arguments.size(); ++i) {
        if (QMetaType::Type(arguments.at(i).userType()) != QMetaType::Int) {
            qCWarning(lcTuioHandler) << "Ignoring malformed TUIO alive message (bad argument on position" << i << arguments << ')';
            return;
        }

        int cursorId = arguments.at(i).toInt();
        if (!oldActiveCursors.contains(cursorId)) {
            // newly active
            QTuioCursor cursor(cursorId);
            cursor.setState(QEventPoint::State::Pressed);
            newActiveCursors.insert(cursorId, cursor);
        } else {
            // we already know about it, remove it so it isn't marked as released
            QTuioCursor cursor = oldActiveCursors.value(cursorId);
            cursor.setState(QEventPoint::State::Stationary); // position change in SET will update if needed
            newActiveCursors.insert(cursorId, cursor);
            oldActiveCursors.remove(cursorId);
        }
    }

    // anything left is dead now
    QMap<int, QTuioCursor>::ConstIterator it = oldActiveCursors.constBegin();

    // deadCursors should be cleared from the last FSEQ now
    m_deadCursors.reserve(oldActiveCursors.size());

    // TODO: there could be an issue of resource exhaustion here if FSEQ isn't
    // sent in a timely fashion. we should probably track message counts and
    // force-flush if we get too many built up.
    while (it != oldActiveCursors.constEnd()) {
        m_deadCursors.append(it.value());
        ++it;
    }

    m_activeCursors = newActiveCursors;
}